

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void fetchTransformedBilinearARGB32PM_simple_scale_helper<(TextureBlendType)4>
               (uint *b,uint *end,QTextureData *image,int *fx,int *fy,int fdx,int param_7)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int offset_00;
  int iVar8;
  uchar *puVar9;
  uchar *puVar10;
  int *fx_00;
  int *piVar11;
  int *in_RCX;
  QTextureData *in_RDX;
  long in_RSI;
  long in_RDI;
  uint *in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint b_2;
  uint t_1;
  __m128i rRB;
  __m128i rAG;
  __m128i bottomRB;
  __m128i bottomAG;
  __m128i bottom;
  __m128i topRB;
  __m128i topAG;
  __m128i top;
  __m128i colorMask;
  __m128i idisty_;
  __m128i disty_;
  quint32 ag;
  quint32 rb;
  uint b_1;
  uint t;
  int lim;
  int f;
  int offset;
  int adjust;
  int length;
  int idisty;
  int disty;
  uint *s2;
  uint *s1;
  int count;
  int x;
  int y2;
  int y1;
  IntermediateBuffer intermediate;
  uint in_stack_ffffffffffffbc5c;
  undefined2 uVar17;
  uint uVar16;
  int fdx_00;
  uint in_stack_ffffffffffffbc70;
  uint in_stack_ffffffffffffbc74;
  uint *in_stack_ffffffffffffbc78;
  uint *in_stack_ffffffffffffbc80;
  undefined8 local_4378;
  undefined8 uStack_4370;
  int local_42b8;
  short local_42a8;
  short local_42a4;
  ushort local_4208;
  ushort uStack_4206;
  ushort uStack_4204;
  ushort uStack_4202;
  ushort uStack_4200;
  ushort uStack_41fe;
  ushort uStack_41fc;
  ushort uStack_41fa;
  ushort local_41e8;
  ushort uStack_41e6;
  ushort uStack_41e4;
  ushort uStack_41e2;
  ushort uStack_41e0;
  ushort uStack_41de;
  ushort uStack_41dc;
  ushort uStack_41da;
  short local_4188;
  short sStack_4186;
  short sStack_4184;
  short sStack_4182;
  short sStack_4180;
  short sStack_417e;
  short sStack_417c;
  short sStack_417a;
  short local_4148;
  short sStack_4146;
  short sStack_4144;
  short sStack_4142;
  short sStack_4140;
  short sStack_413e;
  short sStack_413c;
  short sStack_413a;
  int local_4034;
  int local_4030;
  int local_402c;
  int local_4028;
  int local_4024;
  int local_4020;
  int local_401c;
  uint local_4018 [2];
  undefined8 auStack_4010 [1024];
  uint auStack_2010 [2];
  undefined8 auStack_2008 [1024];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_4020 = (int)*in_R8 >> 0x10;
  local_4024 = -0x55555556;
  local_401c = in_R9D;
  fetchTransformedBilinear_pixelBounds<(TextureBlendType)4>
            (in_RDX->height,in_RDX->y1,in_RDX->y2 + -1,&local_4020,&local_4024);
  puVar9 = QTextureData::scanLine(in_RDX,local_4020);
  puVar10 = QTextureData::scanLine(in_RDX,local_4024);
  uVar1 = *in_R8;
  iVar6 = (int)(uVar1 & 0xffff) >> 8;
  iVar7 = 0x100 - iVar6;
  iVar8 = (int)(in_RSI - in_RDI >> 2);
  if (local_401c < 0) {
    offset_00 = local_401c * iVar8;
  }
  else {
    offset_00 = 0;
  }
  local_4028 = *in_RCX + offset_00 >> 0x10;
  fx_00 = (int *)(long)iVar8;
  iVar8 = qAbs<int>(&local_401c);
  local_402c = (int)(((long)fx_00 * (long)iVar8 + 0xffff) / 0x10000) + 2;
  local_42b8 = 0;
  local_4030 = in_RDX->x2 - local_4028;
  piVar11 = qMin<int>(&local_402c,&local_4030);
  uVar17 = (undefined2)(in_stack_ffffffffffffbc5c >> 0x10);
  iVar8 = *piVar11;
  if (local_4028 < in_RDX->x1) {
    uVar2 = *(uint *)(puVar9 + (long)in_RDX->x1 * 4);
    uVar3 = *(uint *)(puVar10 + (long)in_RDX->x1 * 4);
    do {
      local_4018[local_42b8] =
           (uVar2 & 0xff00ff) * iVar7 + (uVar3 & 0xff00ff) * iVar6 >> 8 & 0xff00ff;
      auStack_2010[local_42b8] =
           (uVar2 >> 8 & 0xff00ff) * iVar7 + (uVar3 >> 8 & 0xff00ff) * iVar6 >> 8 & 0xff00ff;
      local_42b8 = local_42b8 + 1;
      local_4028 = local_4028 + 1;
      uVar16 = in_stack_ffffffffffffbc5c & 0xffffff;
      if (local_4028 < in_RDX->x1) {
        uVar16 = CONCAT13(local_42b8 < iVar8,(int3)in_stack_ffffffffffffbc5c);
      }
      uVar17 = (undefined2)(uVar16 >> 0x10);
      in_stack_ffffffffffffbc5c = uVar16;
    } while ((char)(uVar16 >> 0x18) != '\0');
  }
  local_42a4 = (short)((uVar1 & 0xffff) >> 8);
  local_42a8 = (short)iVar7;
  fdx_00 = CONCAT22(uVar17,local_42a8);
  for (; local_42b8 < iVar8 + -3; local_42b8 = local_42b8 + 4) {
    uVar4 = *(ulong *)(puVar9 + (long)local_4028 * 4);
    uVar5 = *(ulong *)((long)(puVar9 + (long)local_4028 * 4) + 8);
    local_41e8 = (ushort)uVar4;
    uStack_41e6 = (ushort)(uVar4 >> 0x10);
    uStack_41e4 = (ushort)(uVar4 >> 0x20);
    uStack_41e0 = (ushort)uVar5;
    uStack_41de = (ushort)(uVar5 >> 0x10);
    uStack_41dc = (ushort)(uVar5 >> 0x20);
    uVar12 = uVar4 & 0xff00ff00ff00ff;
    uVar14 = uVar5 & 0xff00ff00ff00ff;
    local_4148 = (short)uVar12;
    sStack_4146 = (short)(uVar12 >> 0x10);
    sStack_4144 = (short)(uVar12 >> 0x20);
    sStack_4142 = (short)(uVar12 >> 0x30);
    sStack_4140 = (short)uVar14;
    sStack_413e = (short)(uVar14 >> 0x10);
    sStack_413c = (short)(uVar14 >> 0x20);
    sStack_413a = (short)(uVar14 >> 0x30);
    uVar12 = *(ulong *)(puVar10 + (long)local_4028 * 4);
    uVar14 = *(ulong *)((long)(puVar10 + (long)local_4028 * 4) + 8);
    local_4208 = (ushort)uVar12;
    uStack_4206 = (ushort)(uVar12 >> 0x10);
    uStack_4204 = (ushort)(uVar12 >> 0x20);
    uStack_4200 = (ushort)uVar14;
    uStack_41fe = (ushort)(uVar14 >> 0x10);
    uStack_41fc = (ushort)(uVar14 >> 0x20);
    uVar13 = uVar12 & 0xff00ff00ff00ff;
    uVar15 = uVar14 & 0xff00ff00ff00ff;
    local_4188 = (short)uVar13;
    sStack_4186 = (short)(uVar13 >> 0x10);
    sStack_4184 = (short)(uVar13 >> 0x20);
    sStack_4182 = (short)(uVar13 >> 0x30);
    sStack_4180 = (short)uVar15;
    sStack_417e = (short)(uVar15 >> 0x10);
    sStack_417c = (short)(uVar15 >> 0x20);
    sStack_417a = (short)(uVar15 >> 0x30);
    local_4378 = CONCAT26((ushort)((ushort)(uVar4 >> 0x38) * local_42a8 +
                                  (ushort)(uVar12 >> 0x38) * local_42a4) >> 8,
                          CONCAT24((ushort)((uStack_41e4 >> 8) * local_42a8 +
                                           (uStack_4204 >> 8) * local_42a4) >> 8,
                                   CONCAT22((ushort)((uStack_41e6 >> 8) * local_42a8 +
                                                    (uStack_4206 >> 8) * local_42a4) >> 8,
                                            (ushort)((local_41e8 >> 8) * local_42a8 +
                                                    (local_4208 >> 8) * local_42a4) >> 8)));
    uStack_4370 = CONCAT26((ushort)((ushort)(uVar5 >> 0x38) * local_42a8 +
                                   (ushort)(uVar14 >> 0x38) * local_42a4) >> 8,
                           CONCAT24((ushort)((uStack_41dc >> 8) * local_42a8 +
                                            (uStack_41fc >> 8) * local_42a4) >> 8,
                                    CONCAT22((ushort)((uStack_41de >> 8) * local_42a8 +
                                                     (uStack_41fe >> 8) * local_42a4) >> 8,
                                             (ushort)((uStack_41e0 >> 8) * local_42a8 +
                                                     (uStack_4200 >> 8) * local_42a4) >> 8)));
    *(undefined8 *)(auStack_2010 + local_42b8) = local_4378;
    *(undefined8 *)((long)auStack_2008 + (long)local_42b8 * 4) = uStack_4370;
    in_stack_ffffffffffffbc78 =
         (uint *)CONCAT26((ushort)(sStack_4142 * local_42a8 + sStack_4182 * local_42a4) >> 8,
                          CONCAT24((ushort)(sStack_4144 * local_42a8 + sStack_4184 * local_42a4) >>
                                   8,CONCAT22((ushort)(sStack_4146 * local_42a8 +
                                                      sStack_4186 * local_42a4) >> 8,
                                              (ushort)(local_4148 * local_42a8 +
                                                      local_4188 * local_42a4) >> 8)));
    in_stack_ffffffffffffbc80 =
         (uint *)CONCAT26((ushort)(sStack_413a * local_42a8 + sStack_417a * local_42a4) >> 8,
                          CONCAT24((ushort)(sStack_413c * local_42a8 + sStack_417c * local_42a4) >>
                                   8,CONCAT22((ushort)(sStack_413e * local_42a8 +
                                                      sStack_417e * local_42a4) >> 8,
                                              (ushort)(sStack_4140 * local_42a8 +
                                                      sStack_4180 * local_42a4) >> 8)));
    *(uint **)(local_4018 + local_42b8) = in_stack_ffffffffffffbc78;
    *(uint **)((long)auStack_4010 + (long)local_42b8 * 4) = in_stack_ffffffffffffbc80;
    local_4028 = local_4028 + 4;
  }
  for (; local_42b8 < local_402c; local_42b8 = local_42b8 + 1) {
    local_4034 = in_RDX->x2 + -1;
    piVar11 = qMin<int>(&local_4028,&local_4034);
    local_4028 = *piVar11;
    in_stack_ffffffffffffbc74 = *(uint *)(puVar9 + (long)local_4028 * 4);
    in_stack_ffffffffffffbc70 = *(uint *)(puVar10 + (long)local_4028 * 4);
    local_4018[local_42b8] =
         (in_stack_ffffffffffffbc74 & 0xff00ff) * iVar7 +
         (in_stack_ffffffffffffbc70 & 0xff00ff) * iVar6 >> 8 & 0xff00ff;
    auStack_2010[local_42b8] =
         (in_stack_ffffffffffffbc74 >> 8 & 0xff00ff) * iVar7 +
         (in_stack_ffffffffffffbc70 >> 8 & 0xff00ff) * iVar6 >> 8 & 0xff00ff;
    local_4028 = local_4028 + 1;
  }
  intermediate_adder(in_stack_ffffffffffffbc80,in_stack_ffffffffffffbc78,
                     (IntermediateBuffer *)
                     CONCAT44(in_stack_ffffffffffffbc74,in_stack_ffffffffffffbc70),offset_00,fx_00,
                     fdx_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinearARGB32PM_simple_scale_helper(uint *b, uint *end, const QTextureData &image,
                                                                             int &fx, int &fy, int fdx, int /*fdy*/)
{
    int y1 = (fy >> 16);
    int y2;
    fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);
    const uint *s1 = (const uint *)image.scanLine(y1);
    const uint *s2 = (const uint *)image.scanLine(y2);

    const int disty = (fy & 0x0000ffff) >> 8;
    const int idisty = 256 - disty;
    const int length = end - b;

    // The intermediate buffer is generated in the positive direction
    const int adjust = (fdx < 0) ? fdx * length : 0;
    const int offset = (fx + adjust) >> 16;
    int x = offset;

    Q_DECL_UNINITIALIZED IntermediateBuffer intermediate;
    // count is the size used in the intermediate.buffer.
    int count = (qint64(length) * qAbs(fdx) + fixed_scale - 1) / fixed_scale + 2;
    // length is supposed to be <= BufferSize either because data->m11 < 1 or
    // data->m11 < 2, and any larger buffers split
    Q_ASSERT(count <= BufferSize + 2);
    int f = 0;
    int lim = count;
    if (blendType == BlendTransformedBilinearTiled) {
        x %= image.width;
        if (x < 0) x += image.width;
    } else {
        lim = qMin(count, image.x2 - x);
        if (x < image.x1) {
            Q_ASSERT(x < image.x2);
            uint t = s1[image.x1];
            uint b = s2[image.x1];
            quint32 rb = (((t & 0xff00ff) * idisty + (b & 0xff00ff) * disty) >> 8) & 0xff00ff;
            quint32 ag = ((((t>>8) & 0xff00ff) * idisty + ((b>>8) & 0xff00ff) * disty) >> 8) & 0xff00ff;
            do {
                intermediate.buffer_rb[f] = rb;
                intermediate.buffer_ag[f] = ag;
                f++;
                x++;
            } while (x < image.x1 && f < lim);
        }
    }

    if (blendType != BlendTransformedBilinearTiled) {
#if defined(__SSE2__)
        const __m128i disty_ = _mm_set1_epi16(disty);
        const __m128i idisty_ = _mm_set1_epi16(idisty);
        const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);

        lim -= 3;
        for (; f < lim; x += 4, f += 4) {
            // Load 4 pixels from s1, and split the alpha-green and red-blue component
            __m128i top = _mm_loadu_si128((const __m128i*)((const uint *)(s1)+x));
            __m128i topAG = _mm_srli_epi16(top, 8);
            __m128i topRB = _mm_and_si128(top, colorMask);
            // Multiplies each color component by idisty
            topAG = _mm_mullo_epi16 (topAG, idisty_);
            topRB = _mm_mullo_epi16 (topRB, idisty_);

            // Same for the s2 vector
            __m128i bottom = _mm_loadu_si128((const __m128i*)((const uint *)(s2)+x));
            __m128i bottomAG = _mm_srli_epi16(bottom, 8);
            __m128i bottomRB = _mm_and_si128(bottom, colorMask);
            bottomAG = _mm_mullo_epi16 (bottomAG, disty_);
            bottomRB = _mm_mullo_epi16 (bottomRB, disty_);

            // Add the values, and shift to only keep 8 significant bits per colors
            __m128i rAG =_mm_add_epi16(topAG, bottomAG);
            rAG = _mm_srli_epi16(rAG, 8);
            _mm_storeu_si128((__m128i*)(&intermediate.buffer_ag[f]), rAG);
            __m128i rRB =_mm_add_epi16(topRB, bottomRB);
            rRB = _mm_srli_epi16(rRB, 8);
            _mm_storeu_si128((__m128i*)(&intermediate.buffer_rb[f]), rRB);
        }
#elif defined(__ARM_NEON__)
        const int16x8_t disty_ = vdupq_n_s16(disty);
        const int16x8_t idisty_ = vdupq_n_s16(idisty);
        const int16x8_t colorMask = vdupq_n_s16(0x00ff);

        lim -= 3;
        for (; f < lim; x += 4, f += 4) {
            // Load 4 pixels from s1, and split the alpha-green and red-blue component
            int16x8_t top = vld1q_s16((int16_t*)((const uint *)(s1)+x));
            int16x8_t topAG = vreinterpretq_s16_u16(vshrq_n_u16(vreinterpretq_u16_s16(top), 8));
            int16x8_t topRB = vandq_s16(top, colorMask);
            // Multiplies each color component by idisty
            topAG = vmulq_s16(topAG, idisty_);
            topRB = vmulq_s16(topRB, idisty_);

            // Same for the s2 vector
            int16x8_t bottom = vld1q_s16((int16_t*)((const uint *)(s2)+x));
            int16x8_t bottomAG = vreinterpretq_s16_u16(vshrq_n_u16(vreinterpretq_u16_s16(bottom), 8));
            int16x8_t bottomRB = vandq_s16(bottom, colorMask);
            bottomAG = vmulq_s16(bottomAG, disty_);
            bottomRB = vmulq_s16(bottomRB, disty_);

            // Add the values, and shift to only keep 8 significant bits per colors
            int16x8_t rAG = vaddq_s16(topAG, bottomAG);
            rAG = vreinterpretq_s16_u16(vshrq_n_u16(vreinterpretq_u16_s16(rAG), 8));
            vst1q_s16((int16_t*)(&intermediate.buffer_ag[f]), rAG);
            int16x8_t rRB = vaddq_s16(topRB, bottomRB);
            rRB = vreinterpretq_s16_u16(vshrq_n_u16(vreinterpretq_u16_s16(rRB), 8));
            vst1q_s16((int16_t*)(&intermediate.buffer_rb[f]), rRB);
        }
#elif defined(__loongarch_sx)
        const __m128i disty_ = __lsx_vreplgr2vr_h(disty);
        const __m128i idisty_ = __lsx_vreplgr2vr_h(idisty);
        const __m128i colorMask = __lsx_vreplgr2vr_w(0x00ff00ff);

        lim -= 3;
        for (; f < lim; x += 4, f += 4) {
            // Load 4 pixels from s1, and split the alpha-green and red-blue component
            __m128i top = __lsx_vld((const __m128i*)((const uint *)(s1)+x), 0);
            __m128i topAG = __lsx_vsrli_h(top, 8);
            __m128i topRB = __lsx_vand_v(top, colorMask);
            // Multiplies each color component by idisty
            topAG = __lsx_vmul_h(topAG, idisty_);
            topRB = __lsx_vmul_h(topRB, idisty_);

            // Same for the s2 vector
            __m128i bottom = __lsx_vld((const __m128i*)((const uint *)(s2)+x), 0);
            __m128i bottomAG = __lsx_vsrli_h(bottom, 8);
            __m128i bottomRB = __lsx_vand_v(bottom, colorMask);
            bottomAG = __lsx_vmul_h(bottomAG, disty_);
            bottomRB = __lsx_vmul_h(bottomRB, disty_);

            // Add the values, and shift to only keep 8 significant bits per colors
            __m128i rAG = __lsx_vadd_h(topAG, bottomAG);
            rAG = __lsx_vsrli_h(rAG, 8);
            __lsx_vst(rAG, (__m128i*)(&intermediate.buffer_ag[f]), 0);
            __m128i rRB = __lsx_vadd_h(topRB, bottomRB);
            rRB = __lsx_vsrli_h(rRB, 8);
            __lsx_vst(rRB, (__m128i*)(&intermediate.buffer_rb[f]), 0);
        }
#endif
    }
    for (; f < count; f++) { // Same as above but without simd
        if (blendType == BlendTransformedBilinearTiled) {
            if (x >= image.width) x -= image.width;
        } else {
            x = qMin(x, image.x2 - 1);
        }

        uint t = s1[x];
        uint b = s2[x];

        intermediate.buffer_rb[f] = (((t & 0xff00ff) * idisty + (b & 0xff00ff) * disty) >> 8) & 0xff00ff;
        intermediate.buffer_ag[f] = ((((t>>8) & 0xff00ff) * idisty + ((b>>8) & 0xff00ff) * disty) >> 8) & 0xff00ff;
        x++;
    }

    // Now interpolate the values from the intermediate.buffer to get the final result.
    intermediate_adder(b, end, intermediate, offset, fx, fdx);
}